

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvm.cpp
# Opt level: O2

void __thiscall
Kvm::addEnvProc(Kvm *this,Value *env,char *schemeName,_func_Value_ptr_Kvm_ptr_Value_ptr *proc)

{
  Value *result2;
  Value *result1;
  GcGuard guard;
  allocator<char> local_61;
  Value *local_60;
  Value *local_58;
  GcGuard local_50;
  string local_40;
  
  local_58 = (Value *)0x0;
  local_60 = (Value *)0x0;
  local_50.gc_ = &this->gc_;
  local_50.times_ = 0;
  GcGuard::pushLocalStackRoot(&local_50,&local_58);
  GcGuard::pushLocalStackRoot(&local_50,&local_60);
  local_60 = makeProc(this,proc);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,schemeName,&local_61);
  local_58 = makeSymbol(this,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  defineVariable(this,local_58,local_60,env);
  GcGuard::~GcGuard(&local_50);
  return;
}

Assistant:

void Kvm::addEnvProc(Value *env, const char *schemeName, const Value * (*proc)(Kvm *vm, const Value *))
{
    const Value *result1 = nullptr;
    const Value *result2 = nullptr;
    GcGuard guard{gc_};
    guard.pushLocalStackRoot(&result1);
    guard.pushLocalStackRoot(&result2);
    result2 = makeProc(proc);
    result1 = makeSymbol(schemeName);
    defineVariable(result1, result2, env);
}